

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFindPackageCommand::LoadPackageRegistryDir
          (cmFindPackageCommand *this,string *dir,cmSearchPath *outPaths)

{
  bool bVar1;
  unsigned_long uVar2;
  cmFindPackageCommand *this_00;
  ulong dindex;
  cmFindPackageCommandHoldFile holdFile;
  Directory files;
  string fentry;
  string fname;
  ifstream fin;
  byte abStack_218 [488];
  
  cmsys::Directory::Directory(&files);
  bVar1 = cmsys::Directory::Load(&files,dir);
  if (bVar1) {
    fname._M_dataplus._M_p = (pointer)&fname.field_2;
    fname._M_string_length = 0;
    fname.field_2._M_local_buf[0] = '\0';
    dindex = 0;
    while( true ) {
      uVar2 = cmsys::Directory::GetNumberOfFiles(&files);
      if (uVar2 <= dindex) break;
      std::__cxx11::string::_M_assign((string *)&fname);
      std::__cxx11::string::append((char *)&fname);
      cmsys::Directory::GetFile(&files,dindex);
      std::__cxx11::string::append((char *)&fname);
      bVar1 = cmsys::SystemTools::FileIsDirectory(&fname);
      if (!bVar1) {
        holdFile.File = fname._M_dataplus._M_p;
        std::ifstream::ifstream((cmFindPackageCommand *)&fin,fname._M_dataplus._M_p,_S_in|_S_bin);
        fentry._M_dataplus._M_p = (pointer)&fentry.field_2;
        fentry._M_string_length = 0;
        fentry.field_2._M_local_buf[0] = '\0';
        if ((abStack_218[(long)_fin[-3]] & 5) == 0) {
          this_00 = (cmFindPackageCommand *)&fin;
          bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&fentry,(bool *)0x0,-1);
          if (bVar1) {
            bVar1 = CheckPackageRegistryEntry(this_00,&fentry,outPaths);
            if (bVar1) {
              holdFile.File = (char *)0x0;
            }
          }
        }
        std::__cxx11::string::~string((string *)&fentry);
        std::ifstream::~ifstream((cmFindPackageCommand *)&fin);
        cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile(&holdFile);
      }
      dindex = dindex + 1;
    }
    std::__cxx11::string::~string((string *)&fname);
  }
  cmsys::Directory::~Directory(&files);
  return;
}

Assistant:

void cmFindPackageCommand::LoadPackageRegistryDir(std::string const& dir,
                                                  cmSearchPath& outPaths)
{
  cmsys::Directory files;
  if (!files.Load(dir)) {
    return;
  }

  std::string fname;
  for (unsigned long i = 0; i < files.GetNumberOfFiles(); ++i) {
    fname = dir;
    fname += "/";
    fname += files.GetFile(i);

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // Hold this file hostage until it behaves.
      cmFindPackageCommandHoldFile holdFile(fname.c_str());

      // Load the file.
      cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
      std::string fentry;
      if (fin && cmSystemTools::GetLineFromStream(fin, fentry) &&
          this->CheckPackageRegistryEntry(fentry, outPaths)) {
        // The file references an existing package, so release it.
        holdFile.Release();
      }
    }
  }

  // TODO: Wipe out the directory if it is empty.
}